

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::SliceDynamicLayerParams::Clear(SliceDynamicLayerParams *this)

{
  (this->beginmasks_).current_size_ = 0;
  (this->endids_).current_size_ = 0;
  (this->endmasks_).current_size_ = 0;
  (this->strides_).current_size_ = 0;
  (this->squeezemasks_).current_size_ = 0;
  return;
}

Assistant:

void SliceDynamicLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.SliceDynamicLayerParams)
  beginmasks_.Clear();
  endids_.Clear();
  endmasks_.Clear();
  strides_.Clear();
  squeezemasks_.Clear();
}